

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.h
# Opt level: O2

void __thiscall chain_of_responsibility::FirstWorker::~FirstWorker(FirstWorker *this)

{
  (this->super_IWorker)._vptr_IWorker = (_func_int **)&PTR___cxa_pure_virtual_00136a68;
  std::__cxx11::string::~string((string *)&(this->super_IWorker).name_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->super_IWorker).next_worker_.
              super___shared_ptr<chain_of_responsibility::IWorker,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

IWorker::~IWorker() {}